

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

N_Vector N_VNew_Serial(sunindextype length,SUNContext_conflict sunctx)

{
  N_Vector p_Var1;
  sunindextype in_RSI;
  long in_RDI;
  sunrealtype *data;
  N_Vector v;
  SUNContext_conflict sunctx_local_scope_;
  void *local_28;
  
  p_Var1 = N_VNewEmpty_Serial(in_RSI,(SUNContext_conflict)in_RSI);
  local_28 = (void *)0x0;
  if (0 < in_RDI) {
    local_28 = malloc(in_RDI << 3);
  }
  *(undefined4 *)((long)p_Var1->content + 8) = 1;
  *(void **)((long)p_Var1->content + 0x10) = local_28;
  return p_Var1;
}

Assistant:

N_Vector N_VNew_Serial(sunindextype length, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  N_Vector v;
  sunrealtype* data;

  SUNAssertNull(length >= 0, SUN_ERR_ARG_OUTOFRANGE);

  v = NULL;
  v = N_VNewEmpty_Serial(length, sunctx);
  SUNCheckLastErrNull();

  /* Create data */
  data = NULL;
  if (length > 0)
  {
    data = (sunrealtype*)malloc(length * sizeof(sunrealtype));
    SUNAssertNull(data, SUN_ERR_MALLOC_FAIL);
  }

  /* Attach data */
  NV_OWN_DATA_S(v) = SUNTRUE;
  NV_DATA_S(v)     = data;

  return (v);
}